

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<absl::lts_20250127::Cord>::GrowNoAnnotate
          (RepeatedField<absl::lts_20250127::Cord> *this,bool was_soo,int old_size,int new_size)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  uint uVar3;
  undefined8 uVar4;
  SooRep *this_00;
  Arena *this_01;
  HeapRep *pHVar5;
  undefined8 *puVar6;
  Cord *pCVar7;
  Nonnull<const_char_*> failure_msg;
  LogMessage *this_02;
  undefined7 in_register_00000031;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  string_view str;
  int local_4c;
  SooRep *local_48;
  LogMessage local_40;
  
  iVar11 = 0;
  if ((int)CONCAT71(in_register_00000031,was_soo) == 0) {
    iVar11 = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (iVar11 < new_size) {
    if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
        (undefined1  [16])0x0) {
      this_01 = internal::SooRep::soo_arena(&this->soo_rep_);
    }
    else {
      pHVar5 = heap_rep(this);
      this_01 = (pHVar5->field_0).arena;
    }
    if (new_size < 1) {
      uVar10 = 1;
    }
    else if (iVar11 < 0x3ffffff8) {
      if (iVar11 < 0) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
                   ,0x493,"capacity == 0 || capacity >= lower_limit");
        local_4c = iVar11;
        this_02 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>
                            (&local_40,&local_4c);
        str._M_str = " ";
        str._M_len = 1;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_02,str);
        local_4c = 1;
        absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(this_02,&local_4c);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_40);
      }
      uVar3 = iVar11 * 2 + 1;
      if ((uint)new_size < uVar3) {
        new_size = uVar3;
      }
      uVar10 = (ulong)(uint)new_size;
    }
    else {
      uVar10 = 0x7fffffff;
    }
    local_48 = &this->soo_rep_;
    if (this_01 == (Arena *)0x0) {
      uVar8 = uVar10 * 0x10 + 0x10;
      if (*(code **)(in_FS_OFFSET + -0x48) == (code *)0x0) {
        puVar6 = (undefined8 *)operator_new(uVar8);
      }
      else {
        auVar12 = (**(code **)(in_FS_OFFSET + -0x48))(uVar8,*(undefined8 *)(in_FS_OFFSET + -0x40));
        puVar6 = auVar12._0_8_;
        uVar10 = auVar12._8_8_ - 0x10U >> 4;
      }
      uVar8 = 0x7fffffff;
      if (uVar10 < 0x7fffffff) {
        uVar8 = uVar10;
      }
    }
    else {
      puVar6 = (undefined8 *)Arena::AllocateForArray(this_01,uVar10 * 0x10 + 0x17 & 0xffffffff0);
      uVar8 = uVar10;
    }
    *puVar6 = this_01;
    if (0 < old_size) {
      pCVar7 = elements((RepeatedField<absl::lts_20250127::Cord> *)local_48,was_soo);
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)&(pCVar7->contents_).data_.rep_.field_0 + lVar9);
        uVar4 = puVar1[1];
        puVar2 = (undefined8 *)((long)puVar6 + lVar9 + 0x10);
        *puVar2 = *puVar1;
        puVar2[1] = uVar4;
        puVar1 = (undefined8 *)((long)&(pCVar7->contents_).data_.rep_.field_0 + lVar9);
        *puVar1 = 0;
        puVar1[1] = 0;
        absl::lts_20250127::Cord::~Cord
                  ((Cord *)((long)&(pCVar7->contents_).data_.rep_.field_0 + lVar9));
        lVar9 = lVar9 + 0x10;
      } while ((ulong)(uint)old_size << 4 != lVar9);
    }
    this_00 = local_48;
    if (!was_soo) {
      InternalDeallocate<false>((RepeatedField<absl::lts_20250127::Cord> *)local_48);
    }
    internal::SooRep::set_non_soo(this_00,was_soo,(int)uVar8,puVar6 + 2);
    return;
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)new_size,(long)iVar11,"new_size > old_capacity");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x4ad,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_40);
}

Assistant:

PROTOBUF_NOINLINE void RepeatedField<Element>::GrowNoAnnotate(bool was_soo,
                                                              int old_size,
                                                              int new_size) {
  const int old_capacity = Capacity(was_soo);
  ABSL_DCHECK_GT(new_size, old_capacity);
  HeapRep* new_rep;
  Arena* arena = GetArena();

  new_size = internal::CalculateReserveSize<Element, kHeapRepHeaderSize>(
      old_capacity, new_size);

  ABSL_DCHECK_LE(static_cast<size_t>(new_size),
                 (std::numeric_limits<size_t>::max() - kHeapRepHeaderSize) /
                     sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kHeapRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == nullptr) {
    ABSL_DCHECK_LE((bytes - kHeapRepHeaderSize) / sizeof(Element),
                   static_cast<size_t>(std::numeric_limits<int>::max()))
        << "Requested size is too large to fit element count into int.";
    internal::SizedPtr res = internal::AllocateAtLeast(bytes);
    size_t num_available =
        std::min((res.n - kHeapRepHeaderSize) / sizeof(Element),
                 static_cast<size_t>(std::numeric_limits<int>::max()));
    new_size = static_cast<int>(num_available);
    new_rep = static_cast<HeapRep*>(res.p);
  } else {
    new_rep =
        reinterpret_cast<HeapRep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;

  if (old_size > 0) {
    Element* pnew = static_cast<Element*>(new_rep->elements());
    Element* pold = elements(was_soo);
    // TODO: add absl::is_trivially_relocatable<Element>
    if (std::is_trivial<Element>::value) {
      memcpy(static_cast<void*>(pnew), pold, old_size * sizeof(Element));
    } else {
      for (Element* end = pnew + old_size; pnew != end; ++pnew, ++pold) {
        ::new (static_cast<void*>(pnew)) Element(std::move(*pold));
        pold->~Element();
      }
    }
  }
  if (!was_soo) InternalDeallocate();

  soo_rep_.set_non_soo(was_soo, new_size, new_rep->elements());
}